

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<int,signed_char>(void)

{
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_00;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_01;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_02;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_03;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_00;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_04;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_05;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_06;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_01;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_07;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_08;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_09;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_02;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_10;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_11;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_12;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_03;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_13;
  char u2;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st2;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st;
  bool b;
  int t;
  char u;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  char rhs_04;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe60;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  rhs_05;
  undefined2 in_stack_fffffffffffffe64;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe66;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe67;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe70;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe74;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  rhs_06;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_11 [8];
  byte local_9;
  int local_8;
  char local_1;
  
  local_1 = '\0';
  local_8 = 0;
  local_9 = 0;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<signed_char>
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT17(in_stack_fffffffffffffe67.m_int,
                       CONCAT16(in_stack_fffffffffffffe66.m_int,
                                CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int))
                      ),(char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(local_11,&local_1);
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<signed_char>
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe74.m_int,in_stack_fffffffffffffe70.m_int),
             (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_9 = (local_9 ^ 0xff) & 1;
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe74.m_int,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe74.m_int,in_stack_fffffffffffffe70.m_int),
             (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT17(in_stack_fffffffffffffe67.m_int,
                       CONCAT16(in_stack_fffffffffffffe66.m_int,
                                CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int))
                      ),
             (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  SafeInt::operator_cast_to_signed_char
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT17(in_stack_fffffffffffffe67.m_int,
                       CONCAT16(in_stack_fffffffffffffe66.m_int,
                                CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int))
                      ));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),'\0');
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator*
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe70);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator*((char)((uint)in_stack_fffffffffffffe5c >> 0x18),in_stack_fffffffffffffe60);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT17(in_stack_fffffffffffffe67.m_int,
                       CONCAT16(in_stack_fffffffffffffe66.m_int,
                                CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int))
                      ),(char)((uint)in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             in_stack_fffffffffffffe67);
  local_1 = '\x01';
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe74.m_int,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffe74.m_int,in_stack_fffffffffffffe70.m_int),
            (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),'\0');
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe74.m_int,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator%
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe70);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT17(in_stack_fffffffffffffe67.m_int,
                       CONCAT16(in_stack_fffffffffffffe66.m_int,
                                CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int))
                      ),(char)((uint)in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(char)((uint)in_stack_fffffffffffffe74.m_int >> 0x18));
  local_1 = '\x01';
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe74.m_int,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe74.m_int,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),'\0');
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator/
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe70);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator/((char)((uint)in_stack_fffffffffffffe6c >> 0x18),in_stack_fffffffffffffe70);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT17(in_stack_fffffffffffffe67.m_int,
                       CONCAT16(in_stack_fffffffffffffe66.m_int,
                                CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int))
                      ),(char)((uint)in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(char)((uint)in_stack_fffffffffffffe74.m_int >> 0x18));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),'\0');
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator+
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe70);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator+((char)((uint)in_stack_fffffffffffffe5c >> 0x18),in_stack_fffffffffffffe60);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT17(in_stack_fffffffffffffe67.m_int,
                       CONCAT16(in_stack_fffffffffffffe66.m_int,
                                CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int))
                      ),(char)((uint)in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(char)((uint)in_stack_fffffffffffffe74.m_int >> 0x18));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe74.m_int,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_1 = '\0';
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe74.m_int,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),'\0');
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator-
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe70);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator-((char)((uint)in_stack_fffffffffffffe5c >> 0x18),in_stack_fffffffffffffe60);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT17(in_stack_fffffffffffffe67.m_int,
                       CONCAT16(in_stack_fffffffffffffe66.m_int,
                                CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int))
                      ),(char)((uint)in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe74.m_int,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffe74.m_int,in_stack_fffffffffffffe70.m_int),
            (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(char)((uint)in_stack_fffffffffffffe74.m_int >> 0x18));
  local_1 = '\x01';
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffe74.m_int,in_stack_fffffffffffffe70.m_int),
            (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe67.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(char)((uint)in_stack_fffffffffffffe70.m_int >> 0x18));
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator<<(in_stack_fffffffffffffe5c,
             (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(char)((uint)in_stack_fffffffffffffe60.m_int >> 0x18));
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT17(in_stack_fffffffffffffe67.m_int,
                       CONCAT16(in_stack_fffffffffffffe66.m_int,
                                CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int))
                      ),(char)((uint)in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(char)((uint)in_stack_fffffffffffffe74.m_int >> 0x18));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe67.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(char)((uint)in_stack_fffffffffffffe70.m_int >> 0x18));
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator>>(in_stack_fffffffffffffe5c,
             (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(char)((uint)in_stack_fffffffffffffe60.m_int >> 0x18));
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT17(in_stack_fffffffffffffe67.m_int,
                       CONCAT16(in_stack_fffffffffffffe66.m_int,
                                CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int))
                      ),(char)((uint)in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(char)((uint)in_stack_fffffffffffffe74.m_int >> 0x18));
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe70);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),'\0');
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator&(in_stack_fffffffffffffe60.m_int,in_stack_fffffffffffffe66);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe74);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT17(in_stack_fffffffffffffe67.m_int,
                       CONCAT16(in_stack_fffffffffffffe66.m_int,
                                CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int))
                      ),(char)((uint)in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(char)((uint)in_stack_fffffffffffffe74.m_int >> 0x18));
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator|
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe70);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),'\0');
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator|(in_stack_fffffffffffffe60.m_int,in_stack_fffffffffffffe66);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator|=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe74);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT17(in_stack_fffffffffffffe67.m_int,
                       CONCAT16(in_stack_fffffffffffffe66.m_int,
                                CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int))
                      ),(char)((uint)in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(char)((uint)in_stack_fffffffffffffe74.m_int >> 0x18));
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator^
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe70);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),'\0');
  rhs_04 = (char)((uint)in_stack_fffffffffffffe5c >> 0x18);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator^(in_stack_fffffffffffffe60.m_int,in_stack_fffffffffffffe66);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator^=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe74);
  rhs_06.m_int = (char)((uint)in_stack_fffffffffffffe74.m_int >> 0x18);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT17(in_stack_fffffffffffffe67.m_int,
                       CONCAT16(in_stack_fffffffffffffe66.m_int,
                                CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int))
                      ),rhs_04);
  rhs_05.m_int = (char)((uint)in_stack_fffffffffffffe60.m_int >> 0x18);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),rhs_06);
  lhs.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator<(lhs,rhs_05);
  lhs_00.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_00.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_00.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator<(lhs_00,rhs_05.m_int);
  rhs.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  rhs.m_int._0_2_ = in_stack_fffffffffffffe64;
  rhs.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator<(rhs_05.m_int,rhs);
  lhs_01.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_01.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_01.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator<(lhs_01,rhs_05);
  lhs_02.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_02.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_02.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator<=(lhs_02,rhs_05);
  lhs_03.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_03.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_03.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator<=(lhs_03,rhs_05.m_int);
  rhs_00.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  rhs_00.m_int._0_2_ = in_stack_fffffffffffffe64;
  rhs_00.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator<=(rhs_05.m_int,rhs_00);
  lhs_04.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_04.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_04.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator<=(lhs_04,rhs_05);
  lhs_05.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_05.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_05.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator>(lhs_05,rhs_05);
  lhs_06.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_06.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_06.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator>(lhs_06,rhs_05.m_int);
  rhs_01.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  rhs_01.m_int._0_2_ = in_stack_fffffffffffffe64;
  rhs_01.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator>(rhs_05.m_int,rhs_01);
  lhs_07.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_07.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_07.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator>(lhs_07,rhs_05);
  lhs_08.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_08.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_08.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator>=(lhs_08,rhs_05);
  lhs_09.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_09.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_09.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator>=(lhs_09,rhs_05.m_int);
  rhs_02.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  rhs_02.m_int._0_2_ = in_stack_fffffffffffffe64;
  rhs_02.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator>=(rhs_05.m_int,rhs_02);
  lhs_10.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_10.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_10.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator>=(lhs_10,rhs_05);
  lhs_11.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_11.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_11.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator==(lhs_11,rhs_05);
  lhs_12.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_12.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_12.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator==(lhs_12,rhs_05.m_int);
  rhs_03.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  rhs_03.m_int._0_2_ = in_stack_fffffffffffffe64;
  rhs_03.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator==(rhs_05.m_int,rhs_03);
  lhs_13.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_13.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_13.m_int._3_1_ = local_11[0].m_int;
  operator==(lhs_13,rhs_05);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}